

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_setbaudrate(void)

{
  undefined1 local_48 [8];
  termios options;
  speed_t baudrate;
  
  if (-1 < TTY_Fd) {
    options.c_ispeed = tty_baudtosymbol(*(ushort *)DLTTYOut >> 4 & 0xf);
    if (options.c_ispeed == 0xffffffff) {
      error("TTY: tty_setbaudrate");
    }
    else {
      tcgetattr(TTY_Fd,(termios *)local_48);
      cfsetispeed((termios *)local_48,options.c_ispeed);
      cfsetospeed((termios *)local_48,options.c_ispeed);
      tcsetattr(TTY_Fd,0,(termios *)local_48);
    }
  }
  return;
}

Assistant:

void tty_setbaudrate(void)
{
  speed_t baudrate;

  if (TTY_Fd >= 0) {
    if ((baudrate = tty_baudtosymbol(DLTTYOut->line_speed)) != -1) {
        struct termios options;
        tcgetattr(TTY_Fd, &options);
        cfsetispeed(&options, baudrate);
        cfsetospeed(&options, baudrate);
        tcsetattr(TTY_Fd, TCSANOW, &options);
    } else {
      error("TTY: tty_setbaudrate");
    }
  }
}